

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall
icu_63::double_conversion::Bignum::AssignHexString(Bignum *this,Vector<const_char> value)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint *puVar4;
  int local_40;
  uint local_3c;
  int j_1;
  Chunk most_significant_bigit;
  int j;
  Chunk current_bigit;
  int i;
  int string_index;
  int needed_bigits;
  int length;
  Bignum *this_local;
  Vector<const_char> value_local;
  
  this_local = (Bignum *)value.start_;
  value_local.start_._0_4_ = value.length_;
  Zero(this);
  iVar1 = Vector<const_char>::length((Vector<const_char> *)&this_local);
  iVar2 = (iVar1 << 2) / 0x1c;
  EnsureCapacity(this,iVar2 + 1);
  current_bigit = iVar1 - 1;
  for (j = 0; j < iVar2; j = j + 1) {
    most_significant_bigit = 0;
    for (j_1 = 0; j_1 < 7; j_1 = j_1 + 1) {
      pcVar3 = Vector<const_char>::operator[]((Vector<const_char> *)&this_local,current_bigit);
      iVar1 = HexCharValue(*pcVar3);
      most_significant_bigit = (iVar1 << ((byte)(j_1 << 2) & 0x1f)) + most_significant_bigit;
      current_bigit = current_bigit - 1;
    }
    puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,j);
    *puVar4 = most_significant_bigit;
  }
  this->used_digits_ = iVar2;
  local_3c = 0;
  for (local_40 = 0; local_40 <= (int)current_bigit; local_40 = local_40 + 1) {
    pcVar3 = Vector<const_char>::operator[]((Vector<const_char> *)&this_local,local_40);
    iVar1 = HexCharValue(*pcVar3);
    local_3c = iVar1 + local_3c * 0x10;
  }
  if (local_3c != 0) {
    puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_);
    *puVar4 = local_3c;
    this->used_digits_ = this->used_digits_ + 1;
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  int length = value.length();

  int needed_bigits = length * 4 / kBigitSize + 1;
  EnsureCapacity(needed_bigits);
  int string_index = length - 1;
  for (int i = 0; i < needed_bigits - 1; ++i) {
    // These bigits are guaranteed to be "full".
    Chunk current_bigit = 0;
    for (int j = 0; j < kBigitSize / 4; j++) {
      current_bigit += HexCharValue(value[string_index--]) << (j * 4);
    }
    bigits_[i] = current_bigit;
  }
  used_digits_ = needed_bigits - 1;

  Chunk most_significant_bigit = 0;  // Could be = 0;
  for (int j = 0; j <= string_index; ++j) {
    most_significant_bigit <<= 4;
    most_significant_bigit += HexCharValue(value[j]);
  }
  if (most_significant_bigit != 0) {
    bigits_[used_digits_] = most_significant_bigit;
    used_digits_++;
  }
  Clamp();
}